

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestCaseStart
          (PrettyUnitTestResultPrinter *this,TestCase *test_case)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  uint uVar2;
  char *in_R8;
  string counts;
  
  uVar2 = TestSuite::test_to_run_count(test_case);
  FormatCountableNoun_abi_cxx11_(&counts,(testing *)(ulong)uVar2,0x1da6a4,"tests",in_R8);
  ColoredPrintf(kGreen,"[----------] ");
  printf("%s from %s",counts._M_dataplus._M_p,(test_case->name_)._M_dataplus._M_p);
  pbVar1 = (test_case->type_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) ||
     ((pbVar1->_M_dataplus)._M_p == (pointer)0x0)) {
    putchar(10);
  }
  else {
    printf(", where %s = %s\n","TypeParam");
  }
  fflush(_stdout);
  std::__cxx11::string::~string((string *)&counts);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestCaseStart(const TestCase& test_case) {
  const std::string counts =
      FormatCountableNoun(test_case.test_to_run_count(), "test", "tests");
  ColoredPrintf(GTestColor::kGreen, "[----------] ");
  printf("%s from %s", counts.c_str(), test_case.name());
  if (test_case.type_param() == nullptr) {
    printf("\n");
  } else {
    printf(", where %s = %s\n", kTypeParamLabel, test_case.type_param());
  }
  fflush(stdout);
}